

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralString * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                  *args_2,TokenKind *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  LiteralString *this_00;
  LiteralString *local_38;
  
  this_00 = (LiteralString *)operator_new(0xe8);
  LiteralString::LiteralString(this_00,args,args_1,args_2,*args_3,args_4,args_5);
  local_38 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_38);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }